

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBodyHelpers.cpp
# Opt level: O2

void drawVertex(btIDebugDraw *idraw,btVector3 *x,btScalar s,btVector3 *c)

{
  btScalar local_70 [4];
  btVector3 local_60;
  btVector3 local_50;
  btScalar local_40 [4];
  
  local_50.m_floats[1] = 0.0;
  local_50.m_floats[2] = 0.0;
  local_50.m_floats[3] = 0.0;
  local_50.m_floats[0] = s;
  local_40 = (btScalar  [4])operator-(x,&local_50);
  local_60.m_floats[1] = 0.0;
  local_60.m_floats[2] = 0.0;
  local_60.m_floats[3] = 0.0;
  local_60.m_floats[0] = s;
  local_70 = (btScalar  [4])operator+(x,&local_60);
  (*idraw->_vptr_btIDebugDraw[4])(idraw,local_40,local_70,c);
  local_50.m_floats[0] = 0.0;
  local_50.m_floats[2] = 0.0;
  local_50.m_floats[3] = 0.0;
  local_50.m_floats[1] = s;
  local_40 = (btScalar  [4])operator-(x,&local_50);
  local_60.m_floats[0] = 0.0;
  local_60.m_floats[2] = 0.0;
  local_60.m_floats[3] = 0.0;
  local_60.m_floats[1] = s;
  local_70 = (btScalar  [4])operator+(x,&local_60);
  (*idraw->_vptr_btIDebugDraw[4])(idraw,local_40,local_70,c);
  local_50.m_floats[0] = 0.0;
  local_50.m_floats[1] = 0.0;
  local_50.m_floats[3] = 0.0;
  local_50.m_floats[2] = s;
  local_40 = (btScalar  [4])operator-(x,&local_50);
  local_60.m_floats[0] = 0.0;
  local_60.m_floats[1] = 0.0;
  local_60.m_floats[3] = 0.0;
  local_60.m_floats[2] = s;
  local_70 = (btScalar  [4])operator+(x,&local_60);
  (*idraw->_vptr_btIDebugDraw[4])(idraw,local_40,local_70,c);
  return;
}

Assistant:

static void				drawVertex(	btIDebugDraw* idraw,
								   const btVector3& x,btScalar s,const btVector3& c)
{
	idraw->drawLine(x-btVector3(s,0,0),x+btVector3(s,0,0),c);
	idraw->drawLine(x-btVector3(0,s,0),x+btVector3(0,s,0),c);
	idraw->drawLine(x-btVector3(0,0,s),x+btVector3(0,0,s),c);
}